

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  runtime_error *this;
  ulong uVar6;
  size_type sVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  long lVar9;
  uintmax_t fileSize;
  error_category *rootURL;
  long lVar10;
  _Elt_pointer ppVar11;
  float fVar12;
  error_code ec;
  error_code systemError;
  time_t uploadTime;
  CURLSession session;
  type filePath;
  Configuration cfg;
  deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> paths;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  options_description desc;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [144];
  
  curl_global_init(3);
  std::__cxx11::string::string((string *)&cfg,"Options",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&desc,(string *)&cfg,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&cfg);
  cfg._0_8_ = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (&cfg.m_debug,"help");
  boost::program_options::options_description_easy_init::operator()(pcVar3,"verbose,v");
  boost::program_options::variables_map::variables_map(&vm);
  local_178.super_function_base.vtable = (vtable_base *)0x0;
  local_178.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_178.super_function_base.functor._8_8_ = 0;
  local_178.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&cfg,argc,argv,&desc,0,&local_178);
  boost::program_options::store((basic_parsed_options *)&cfg,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&cfg);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_178);
  std::__cxx11::string::string((string *)&cfg,"help",(allocator *)&paths);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)&cfg);
  std::__cxx11::string::~string((string *)&cfg);
  if (sVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,*argv);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = (ostream *)boost::program_options::operator<<(poVar5,&desc);
    std::endl<char,std::char_traits<char>>(poVar5);
    boost::program_options::variables_map::~variables_map(&vm);
    boost::program_options::options_description::~options_description(&desc);
    return 0;
  }
  boost::program_options::notify(&vm);
  Configuration::Configuration(&cfg);
  std::__cxx11::string::string((string *)&paths,"verbose",(allocator *)&filePath);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)&paths);
  if (sVar4 == 0) {
    bVar1 = cfg.m_debug;
    std::__cxx11::string::~string((string *)&paths);
    if (bVar1 == false) goto LAB_00124da3;
  }
  else {
    std::__cxx11::string::~string((string *)&paths);
  }
  cfg.m_verbose = true;
LAB_00124da3:
  if (cfg.m_baseDir._M_string_length == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Base dir cannot be empty");
  }
  else if (cfg.m_baseURL._M_string_length == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Base URL cannot be empty");
  }
  else if ((cfg.m_username._M_string_length == 0) || (cfg.m_password._M_string_length != 0)) {
    if (cfg.m_segment_duration == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Segment duration not specified");
    }
    else if (cfg.m_extensions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             cfg.m_extensions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Extensions list cannot be empty");
    }
    else {
      std::__cxx11::string::string((string *)&paths,(string *)&cfg.m_baseDir);
      bVar1 = boost::filesystem::exists((path *)&paths);
      if (bVar1) {
        std::__cxx11::string::string((string *)&filePath,(string *)&cfg.m_baseDir);
        bVar1 = boost::filesystem::is_directory(&filePath);
        std::__cxx11::string::~string((string *)&filePath);
        std::__cxx11::string::~string((string *)&paths);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Camera streamer is running");
          std::endl<char,std::char_traits<char>>(poVar5);
          if (cfg.m_verbose == true) {
            poVar5 = std::operator<<((ostream *)&std::cout,"* Base directory:      ");
            poVar5 = std::operator<<(poVar5,(string *)&cfg.m_baseDir);
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&std::cout,"* Base URL:            ");
            poVar5 = std::operator<<(poVar5,(string *)&cfg.m_baseURL);
            std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<((ostream *)&std::cout,"* Backlog duration:    ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          CURLSession::CURLSession(&session);
          CURLSession::set_verbose(&session,cfg.m_debug);
          if ((cfg.m_username._M_string_length != 0) && (cfg.m_password._M_string_length != 0)) {
            CURLSession::set_credentials(&session,&cfg.m_username,&cfg.m_password);
          }
          do {
            std::__cxx11::string::string((string *)&filePath,(string *)&cfg.m_baseDir);
            find_upload_files(&paths,(path *)&filePath,&cfg.m_extensions);
            std::__cxx11::string::~string((string *)&filePath);
            if (paths.
                super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                paths.
                super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              filePath.m_pathname._M_dataplus._M_p = (pointer)0xc8;
              std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)&filePath);
            }
            else {
              uVar6 = cfg.m_max_backlog_total_segment_duration / cfg.m_segment_duration;
              if (cfg.m_segment_duration <= cfg.m_max_backlog_total_segment_duration) {
                while (sVar7 = std::
                               deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                               ::size(&paths), uVar6 < sVar7) {
                  ppVar11 = paths.
                            super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (paths.
                      super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      paths.
                      super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    ppVar11 = paths.
                              super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
                  }
                  if (cfg.m_verbose == true) {
                    boost::filesystem::path::filename();
                    pbVar8 = boost::filesystem::operator<<
                                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                        (path *)&filePath);
                    poVar5 = std::operator<<(pbVar8,": Removing from backlog");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    std::__cxx11::string::~string((string *)&filePath);
                  }
                  boost::filesystem::remove((char *)(ppVar11 + -1));
                  std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                  pop_back(&paths);
                }
              }
              lVar10 = cfg.m_segment_duration * 1000000;
              lVar9 = lVar10 / 10;
              do {
                std::__cxx11::string::string
                          ((string *)&filePath,
                           (string *)
                           paths.
                           super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur);
                std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::
                pop_front(&paths);
                fileSize = boost::filesystem::file_size((path *)&filePath);
                uploadTime = 0;
                if (cfg.m_verbose == true) {
                  boost::filesystem::path::filename();
                  pbVar8 = boost::filesystem::operator<<
                                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                      (path *)&systemError);
                  std::operator<<(pbVar8,": Uploading... ");
                  std::__cxx11::string::~string((string *)&systemError);
                  std::ostream::flush();
                }
                rootURL = (error_category *)&cfg.m_baseURL;
                bVar1 = CURLSession::upload_file
                                  (&session,(path *)&filePath,fileSize,(string *)rootURL,&uploadTime
                                  );
                if (bVar1) {
                  lVar10 = lVar10 - uploadTime;
                  if (cfg.m_verbose == true) {
                    fVar12 = (float)uploadTime;
                    poVar5 = std::operator<<((ostream *)&std::cout,"Done. Transfer speed: ");
                    if ((long)fileSize < 0) {
                      rootURL = (error_category *)(fileSize >> 1);
                    }
                    poVar5 = (ostream *)
                             std::ostream::operator<<
                                       (poVar5,((float)fileSize / (fVar12 / 1e+06)) * 0.0009765625);
                    poVar5 = std::operator<<(poVar5," kB/s (");
                    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                    poVar5 = std::operator<<(poVar5," bytes in ");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar12 / 1e+06);
                    poVar5 = std::operator<<(poVar5," second(s))");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    if (cfg.m_debug == true) {
                      if (lVar10 <= lVar9) {
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "No enough time left for current window, refreshing upload file list"
                                                );
                        std::endl<char,std::char_traits<char>>(poVar5);
                      }
                      boost::filesystem::path::filename();
                      pbVar8 = boost::filesystem::operator<<
                                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout
                                          ,(path *)&systemError);
                      std::operator<<(pbVar8,": Removing file from disk... ");
                      std::__cxx11::string::~string((string *)&systemError);
                    }
                  }
                  systemError.val_ = 0;
                  systemError._4_4_ = systemError._4_4_ & 0xffffff00;
                  systemError.cat_ =
                       (error_category *)
                       boost::system::detail::cat_holder<void>::system_category_instance;
                  iVar2 = boost::filesystem::remove((char *)&filePath);
                  if ((char)iVar2 == '\0') {
                    if (cfg.m_verbose == true) {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "Failed to remove uploaded file from disk (");
                      ec.cat_ = rootURL;
                      ec._0_8_ = systemError.cat_;
                      poVar5 = boost::system::operator<<
                                         ((system *)poVar5,
                                          (basic_ostream<char,_std::char_traits<char>_> *)
                                          CONCAT44(systemError._4_4_,systemError.val_),ec);
                      pcVar3 = ")";
                      goto LAB_00125367;
                    }
                  }
                  else {
                    poVar5 = (ostream *)&std::cout;
                    pcVar3 = "Done";
                    if (cfg.m_debug == true) {
LAB_00125367:
                      poVar5 = std::operator<<(poVar5,pcVar3);
                      std::endl<char,std::char_traits<char>>(poVar5);
                    }
                  }
                }
                else if (cfg.m_debug == true) {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "Failed to upload file, breaking from loop.");
                  std::endl<char,std::char_traits<char>>(poVar5);
                }
                std::__cxx11::string::~string((string *)&filePath);
              } while (((bVar1) &&
                       (paths.
                        super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                        paths.
                        super__Deque_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur)) && (lVar9 < lVar10));
            }
            std::deque<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~deque
                      (&paths);
          } while( true );
        }
      }
      else {
        std::__cxx11::string::~string((string *)&paths);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Base directory doesn\'t exist or is not a directory");
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Username provided without a password");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv)
{
    curl_global_init(CURL_GLOBAL_ALL);

    po::options_description desc("Options");
    desc.add_options()
        ("help", "Print help messages")
        ("verbose,v", "Make output verbose");

    po::variables_map vm;

    try
    {
        po::store(po::parse_command_line(argc, argv, desc), vm);

        if (vm.count("help"))
        {
            std::cout << argv[0] << ":" << std::endl << desc << std::endl;
            return 0;
        }

        po::notify(vm);
    }
    catch (const po::error& e)
    {
        std::cerr << "Error: " << e.what() << std::endl << std::endl;
        std::cerr << desc << std::endl;
        return 1;
    }

    int exitResult = 0;

    try
    {
        Configuration cfg;

        if (vm.count("verbose") || cfg.debug())
        {
            cfg.verbose(true);
        }

        if (cfg.base_dir().empty())
        {
            throw std::runtime_error("Base dir cannot be empty");
        }

        if (cfg.base_url().empty())
        {
            throw std::runtime_error("Base URL cannot be empty");
        }

        if (!cfg.username().empty() && cfg.password().empty())
        {
            throw std::runtime_error("Username provided without a password");
        }

        if (!cfg.segment_duration())
        {
            throw std::runtime_error("Segment duration not specified");
        }

        if (cfg.extensions().empty())
        {
            throw std::runtime_error("Extensions list cannot be empty");
        }

        if (!fs::exists(cfg.base_dir()) || !fs::is_directory(cfg.base_dir()))
        {
            throw std::runtime_error("Base directory doesn't exist or is not a directory");
        }

        std::cout << "Camera streamer is running" << std::endl;

        if (cfg.verbose())
        {
            std::cout << "* Base directory:      " << cfg.base_dir() << std::endl;
            std::cout << "* Base URL:            " << cfg.base_url() << std::endl;
            std::cout << "* Backlog duration:    " << cfg.max_backlog_total_segment_duration() << std::endl;
        }

        CURLSession session;

        // Enabling this will dump HTTP traffic to stdout
        session.set_verbose(cfg.debug());

        if (!cfg.username().empty() && !cfg.password().empty())
        {
            session.set_credentials(cfg.username(), cfg.password());
        }

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"

        while (true)
        {
            // First, look for files to upload
            auto paths = find_upload_files(cfg.base_dir(), cfg.extensions());

            if (paths.empty())
            {
                // If we didn't find any files, just sleep a bit and try again later
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                continue;
            }

            // We've found some files to upload.
            // First, we check a backlog - we'll calculate how many items do we have stored in storage, queued for sending
            // and if it's duration will exceed given threshold, we'll just delete them from filesystem. This algorithm
            // will ensure that once we're not ready for sending for a long period of time, we won't go out of storage
            // space. Default for backlog duration is 300 seconds, that is 5 minutes of video - can be changed by
            // environment variable.
            auto maxBacklogItems = cfg.max_backlog_total_segment_duration() / cfg.segment_duration();

            if (maxBacklogItems > 0)
            {
                while (paths.size() > maxBacklogItems)
                {
                    // Since order is from newest to oldest, pop items from the back - the oldest ones.
                    const auto& path = paths.back();

                    if (cfg.verbose())
                    {
                        std::cout << path.filename() << ": Removing from backlog" << std::endl;
                    }

                    fs::remove(path);

                    paths.pop_back();
                }
            }

            // Now it's time for file upload. Since we know for sure segment's duration, we can estimate how much
            // files from the backlog we can send until new segment arrives. In order to do that we'll keep track of
            // the time that we spent on each individual file, starting with a time pool equals to one segment duration
            // (in microseconds). After each upload, we'll subtract spent time from available time. Once available
            // time is negative, it means we need to refresh our upload file list. Minimal threshold for available
            // time is 10% of initial available time - we don't want to start sending next piece just before remaining
            // time is about to end.
            time_t availableUploadTime = cfg.segment_duration() * 1000000;
            time_t uploadTimeThreshold = availableUploadTime / 10;

            do
            {
                auto filePath = std::move(paths.front());
                paths.pop_front();

                auto fileSize = fs::file_size(filePath);
                time_t uploadTime = 0;

                if (cfg.verbose())
                {
                    std::cout << filePath.filename() << ": Uploading... ";
                    std::cout.flush();
                }

                if (!session.upload_file(filePath, fileSize, cfg.base_url(), uploadTime))
                {
                    if (cfg.debug())
                    {
                        std::cout << "Failed to upload file, breaking from loop." << std::endl;
                    }

                    break;
                }

                // Update time frame we have for uploading files from backlog.
                availableUploadTime -= uploadTime;

                if (cfg.verbose())
                {
                    auto elapsed = uploadTime / 1000000.0f;
                    auto transferSpeed = fileSize / elapsed / 1024.0f;

                    std::cout << "Done. Transfer speed: " << transferSpeed << " kB/s (" << fileSize << " bytes in " << elapsed << " second(s))" << std::endl;

                    if (cfg.debug())
                    {
                        if (availableUploadTime <= uploadTimeThreshold)
                        {
                            std::cout << "No enough time left for current window, refreshing upload file list" << std::endl;
                        }

                        std::cout << filePath.filename() << ": Removing file from disk... ";
                    }
                }

                // Since we've uploaded file to the server, we don't need it any more in the filesystem.
                boost::system::error_code systemError;
                if (!fs::remove(filePath, systemError))
                {
                    if (cfg.verbose())
                    {
                        std::cout << "Failed to remove uploaded file from disk (" << systemError << ")" << std::endl;
                    }
                }
                else
                {
                    if (cfg.debug())
                    {
                        std::cout << "Done" << std::endl;
                    }
                }

                // We'll continue looping until there are files in the backlog and we still have some time left.
            } while (!paths.empty() && availableUploadTime > uploadTimeThreshold);
        }

#pragma clang diagnostic pop

    }
    catch (const std::exception& ex)
    {
        std::cerr << "Exception: " << ex.what() << std::endl;
        exitResult = 1;
    }

    curl_global_cleanup();
    return exitResult;
}